

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_start_map(Parser *this,bool as_child)

{
  byte *pbVar1;
  undefined1 uVar2;
  uint uVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  Location LVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  NodeData *pNVar11;
  size_t *psVar12;
  Tree *pTVar13;
  ulong uVar14;
  NodeData *pNVar15;
  State *pSVar16;
  size_t ichild;
  long lVar17;
  char *pcVar18;
  size_t sVar19;
  char *pcVar20;
  Tree *pTVar21;
  size_t iprev_sibling;
  NodeType_e NVar22;
  byte bVar23;
  csubstr cVar24;
  char msg [58];
  char local_128 [24];
  char *pcStack_110;
  undefined8 local_108;
  undefined2 uStack_100;
  undefined6 uStack_fe;
  undefined2 uStack_f8;
  char acStack_f6 [22];
  undefined4 local_e0;
  undefined1 local_dc;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar23 = 0;
  this->m_state->flags = this->m_state->flags & 0xffffff39U | 0x84;
  if ((this->m_stack).m_size == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '_';
    local_128[9] = '\\';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    pcStack_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108._0_1_ = 'e';
    local_108._1_1_ = '\0';
    local_108._2_1_ = '\0';
    local_108._3_1_ = '\0';
    local_108._4_1_ = '\0';
    local_108._5_1_ = '\0';
    local_108._6_1_ = '\0';
    local_108._7_1_ = '\0';
    (*(code *)PTR_error_impl_00297798)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pTVar21 = this->m_tree;
  uVar14 = ((this->m_stack).m_stack)->node_id;
  if (uVar14 == 0xffffffffffffffff) {
    pNVar15 = (NodeData *)0x0;
  }
  else {
    pTVar13 = pTVar21;
    if (pTVar21->m_cap <= uVar14) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
      pTVar13 = this->m_tree;
    }
    pNVar15 = pTVar21->m_buf + uVar14;
    pTVar21 = pTVar13;
  }
  uVar14 = this->m_root_id;
  if (uVar14 == 0xffffffffffffffff) {
    pNVar11 = (NodeData *)0x0;
  }
  else {
    if (pTVar21->m_cap <= uVar14) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar11 = pTVar21->m_buf + uVar14;
  }
  if (pNVar15 != pNVar11) {
    uStack_f8 = 0x6f72;
    builtin_strncpy(acStack_f6,"ot_id))",8);
    local_108._0_1_ = 'o';
    local_108._1_1_ = 'm';
    local_108._2_1_ = '(';
    local_108._3_1_ = ')';
    local_108._4_1_ = ')';
    local_108._5_1_ = ' ';
    local_108._6_1_ = '=';
    local_108._7_1_ = '=';
    uStack_100 = 0x6e20;
    uStack_fe = 0x5f6d2865646f;
    builtin_strncpy(local_128 + 0x10,"ode(m_st",8);
    pcStack_110 = (char *)0x74746f622e6b6361;
    builtin_strncpy(local_128,"check failed: (n",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_58 = 0;
    uStack_50 = 0x780f;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x780f) << 0x40);
    LVar5.name.str._0_4_ = 0x2466fd;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x3a,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar14 = (this->m_stack).m_size;
  psVar12 = &(this->m_stack).m_stack[uVar14 - 2].node_id;
  if (uVar14 < 2) {
    psVar12 = &this->m_root_id;
  }
  sVar19 = *psVar12;
  if (sVar19 == 0xffffffffffffffff) {
    builtin_strncpy(local_128 + 0x10,"arent_id",8);
    pcStack_110 = (char *)0x454e4f4e203d2120;
    builtin_strncpy(local_128,"check failed: (p",0x10);
    local_108._0_2_ = 0x29;
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_80 = 0;
    uStack_78 = 0x7811;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x7811) << 0x40);
    LVar7.name.str._0_4_ = 0x2466fd;
    LVar7.super_LineCol.offset = auVar6._0_8_;
    LVar7.super_LineCol.line = auVar6._8_8_;
    LVar7.super_LineCol.col = auVar6._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x22,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar14 = this->m_state->node_id;
  if (uVar14 != 0xffffffffffffffff) {
    pTVar21 = this->m_tree;
    if (pTVar21->m_cap <= uVar14) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar21->m_buf != (NodeData *)0x0) {
      pTVar21 = this->m_tree;
      uVar14 = this->m_state->node_id;
      if (uVar14 == 0xffffffffffffffff) {
        pNVar15 = (NodeData *)0x0;
      }
      else {
        pTVar13 = pTVar21;
        if (pTVar21->m_cap <= uVar14) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          pcStack_110 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_108._0_1_ = 'e';
          local_108._1_1_ = '\0';
          local_108._2_1_ = '\0';
          local_108._3_1_ = '\0';
          local_108._4_1_ = '\0';
          local_108._5_1_ = '\0';
          local_108._6_1_ = '\0';
          local_108._7_1_ = '\0';
          (*(code *)PTR_error_impl_00297798)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
          pTVar13 = this->m_tree;
        }
        pNVar15 = pTVar21->m_buf + uVar14;
        pTVar21 = pTVar13;
      }
      uVar14 = this->m_root_id;
      if (uVar14 == 0xffffffffffffffff) {
        pNVar11 = (NodeData *)0x0;
      }
      else {
        if (pTVar21->m_cap <= uVar14) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          pcStack_110 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_108._0_1_ = 'e';
          local_108._1_1_ = '\0';
          local_108._2_1_ = '\0';
          local_108._3_1_ = '\0';
          local_108._4_1_ = '\0';
          local_108._5_1_ = '\0';
          local_108._6_1_ = '\0';
          local_108._7_1_ = '\0';
          (*(code *)PTR_error_impl_00297798)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar11 = pTVar21->m_buf + uVar14;
      }
      if (pNVar15 != pNVar11) {
        pcVar18 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
        pcVar20 = local_128;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          *(undefined8 *)pcVar20 = *(undefined8 *)pcVar18;
          pcVar18 = pcVar18 + ((ulong)bVar23 * -2 + 1) * 8;
          pcVar20 = pcVar20 + ((ulong)bVar23 * -2 + 1) * 8;
        }
        local_dc = 0;
        local_e0 = 0x29296469;
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_a8 = 0;
        uStack_a0 = 0x7812;
        local_98 = 0;
        pcStack_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_88 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x7812) << 0x40);
        LVar8.name.str._0_4_ = 0x2466fd;
        LVar8.super_LineCol.offset = auVar6._0_8_;
        LVar8.super_LineCol.line = auVar6._8_8_;
        LVar8.super_LineCol.col = auVar6._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_128,0x4d,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  if (!as_child) {
    if (sVar19 == 0xffffffffffffffff) {
      builtin_strncpy(local_128 + 0x10,"arent_id",8);
      pcStack_110 = (char *)0x454e4f4e203d2120;
      builtin_strncpy(local_128,"check failed: (p",0x10);
      local_108._0_2_ = 0x29;
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_d0 = 0;
      uStack_c8 = 0x7830;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      auVar6 = ZEXT1224(ZEXT412(0x7830) << 0x40);
      LVar9.name.str._0_4_ = 0x2466fd;
      LVar9.super_LineCol.offset = auVar6._0_8_;
      LVar9.super_LineCol.line = auVar6._8_8_;
      LVar9.super_LineCol.col = auVar6._16_8_;
      LVar9.name.str._4_4_ = 0;
      LVar9.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_128,0x22,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
    this->m_state->node_id = sVar19;
    pTVar21 = this->m_tree;
    uVar14 = pTVar21->m_cap;
    pTVar13 = pTVar21;
    if (sVar19 == 0xffffffffffffffff || uVar14 <= sVar19) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pTVar13 = this->m_tree;
      uVar14 = pTVar13->m_cap;
    }
    NVar22 = (NodeType_e)((uint)pTVar21->m_buf[sVar19].m_type.type & 0x10);
    if ((sVar19 == 0xffffffffffffffff) || (uVar14 <= sVar19)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pTVar21 = this->m_tree;
    if ((pTVar13->m_buf[sVar19].m_type.type & MAP) == NOTYPE) {
      bVar10 = Tree::has_children(pTVar21,sVar19);
      if (bVar10) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = '8';
        local_128[9] = 'x';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108._0_1_ = 'e';
        local_108._1_1_ = '\0';
        local_108._2_1_ = '\0';
        local_108._3_1_ = '\0';
        local_108._4_1_ = '\0';
        local_108._5_1_ = '\0';
        local_108._6_1_ = '\0';
        local_108._7_1_ = '\0';
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: !m_tree->has_children(parent_id)",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      Tree::to_map(this->m_tree,sVar19,NVar22);
    }
    else {
      if ((sVar19 == 0xffffffffffffffff) || (pTVar21->m_cap <= sVar19)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x7d;
        local_128[9] = 'K';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108._0_1_ = 'e';
        local_108._1_1_ = '\0';
        local_108._2_1_ = '\0';
        local_108._3_1_ = '\0';
        local_108._4_1_ = '\0';
        local_108._5_1_ = '\0';
        local_108._6_1_ = '\0';
        local_108._7_1_ = '\0';
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar15 = pTVar21->m_buf;
      NVar22 = NVar22 | pNVar15[sVar19].m_type.type;
      Tree::_check_next_flags(pTVar21,sVar19,NVar22);
      pNVar15[sVar19].m_type.type = NVar22;
    }
    _move_scalar_from_top(this);
    if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
      this->m_key_anchor_was_before = true;
    }
    _write_val_anchor(this,sVar19);
    uVar14 = (this->m_stack).m_size;
    if (uVar14 < 2) {
      pSVar16 = this->m_state;
    }
    else {
      pSVar16 = this->m_state;
      if (((this->m_stack).m_stack[uVar14 - 2].flags & 0x800) != 0) {
        pbVar1 = (byte *)((long)&pSVar16->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
    }
    pcVar18 = (pSVar16->line_contents).rem.str;
    pTVar21 = this->m_tree;
    if ((sVar19 == 0xffffffffffffffff) || (pTVar21->m_cap <= sVar19)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7d;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pTVar21->m_buf[sVar19].m_val.scalar.str = pcVar18;
    goto LAB_0021cfd1;
  }
  pTVar21 = this->m_tree;
  uVar14 = pTVar21->m_cap;
  if (sVar19 < uVar14 && sVar19 != 0xffffffffffffffff) {
    pNVar15 = pTVar21->m_buf;
    iprev_sibling = pNVar15[sVar19].m_last_child;
LAB_0021c99d:
    if (uVar14 <= sVar19) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar15 = pTVar21->m_buf;
    }
    uVar2 = (undefined1)pNVar15[sVar19].m_type.type;
  }
  else {
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x7d;
    local_128[9] = 'K';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    pcStack_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108._0_1_ = 'e';
    local_108._1_1_ = '\0';
    local_108._2_1_ = '\0';
    local_108._3_1_ = '\0';
    local_108._4_1_ = '\0';
    local_108._5_1_ = '\0';
    local_108._6_1_ = '\0';
    local_108._7_1_ = '\0';
    (*(code *)PTR_error_impl_00297798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar15 = pTVar21->m_buf;
    iprev_sibling = pNVar15[sVar19].m_last_child;
    if (sVar19 != 0xffffffffffffffff) {
      uVar14 = pTVar21->m_cap;
      goto LAB_0021c99d;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x4f;
    local_128[9] = 'L';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    pcStack_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108 = 0x65;
    (*(code *)PTR_error_impl_00297798)
              ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x7a;
    local_128[9] = 'K';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    pcStack_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108._0_1_ = 'e';
    local_108._1_1_ = '\0';
    local_108._2_1_ = '\0';
    local_108._3_1_ = '\0';
    local_108._4_1_ = '\0';
    local_108._5_1_ = '\0';
    local_108._6_1_ = '\0';
    local_108._7_1_ = '\0';
    (*(code *)PTR_error_impl_00297798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    uVar2 = (undefined1)pTVar21->m_buf[-1].m_type.type;
  }
  if (((uVar2 & (STREAM|MAP)) == NOTYPE) && (bVar10 = Tree::is_root(pTVar21,sVar19), !bVar10)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x4e;
    local_128[9] = 'L';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    pcStack_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108._0_1_ = 'e';
    local_108._1_1_ = '\0';
    local_108._2_1_ = '\0';
    local_108._3_1_ = '\0';
    local_108._4_1_ = '\0';
    local_108._5_1_ = '\0';
    local_108._6_1_ = '\0';
    local_108._7_1_ = '\0';
    (*(code *)PTR_error_impl_00297798)
              ("check failed: is_container(parent) || is_root(parent)",0x35,
               (anonymous_namespace)::s_default_callbacks);
  }
  if (iprev_sibling != 0xffffffffffffffff) {
    if (pTVar21->m_cap <= iprev_sibling) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7d;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (pTVar21->m_buf[iprev_sibling].m_parent != sVar19) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x4d;
      local_128[9] = 'L';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  ichild = Tree::_claim(pTVar21);
  Tree::_set_hierarchy(pTVar21,ichild,sVar19,iprev_sibling);
  pSVar16 = this->m_state;
  pSVar16->node_id = ichild;
  uVar3 = pSVar16->flags;
  if ((uVar3 >> 9 & 1) == 0) {
    Tree::to_map(this->m_tree,ichild,0);
  }
  else {
    cVar24 = _consume_scalar(this);
    Tree::to_map(this->m_tree,this->m_state->node_id,cVar24,(ulong)((uVar3 & 0x400) << 3));
    _write_key_anchor(this,this->m_state->node_id);
    if ((this->m_key_tag).str != (char *)0x0 && (this->m_key_tag).len != 0) {
      pTVar21 = this->m_tree;
      sVar19 = this->m_state->node_id;
      cVar24 = normalize_tag(this->m_key_tag);
      Tree::set_key_tag(pTVar21,sVar19,cVar24);
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
    }
  }
  uVar14 = this->m_state->node_id;
  pcVar18 = (this->m_state->line_contents).rem.str;
  pTVar21 = this->m_tree;
  if ((uVar14 == 0xffffffffffffffff) || (sVar19 = uVar14, pTVar21->m_cap <= uVar14)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x7d;
    local_128[9] = 'K';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    pcStack_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108._0_1_ = 'e';
    local_108._1_1_ = '\0';
    local_108._2_1_ = '\0';
    local_108._3_1_ = '\0';
    local_108._4_1_ = '\0';
    local_108._5_1_ = '\0';
    local_108._6_1_ = '\0';
    local_108._7_1_ = '\0';
    (*(code *)PTR_error_impl_00297798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    sVar19 = this->m_state->node_id;
  }
  pTVar21->m_buf[uVar14].m_val.scalar.str = pcVar18;
  _write_val_anchor(this,sVar19);
LAB_0021cfd1:
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar21 = this->m_tree;
    sVar19 = this->m_state->node_id;
    cVar24 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar21,sVar19,cVar24);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  return;
}

Assistant:

void Parser::_start_map(bool as_child)
{
    _c4dbgpf("start_map (as child={})", as_child);
    addrem_flags(RMAP|RVAL, RKEY|RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            type_bits key_quoted = NOTYPE;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_map(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_map: id={} key='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            m_tree->to_map(m_state->node_id);
            _c4dbgpf("start_map: id={}", m_state->node_id);
        }
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
        _write_val_anchor(m_state->node_id);
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
        m_state->node_id = parent_id;
        _c4dbgpf("start_map: id={}", m_state->node_id);
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_map(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_map(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        if(m_key_anchor.not_empty())
            m_key_anchor_was_before = true;
        _write_val_anchor(parent_id);
        if(m_stack.size() >= 2)
        {
            State const& parent_state = m_stack.top(1);
            if(parent_state.flags & RSET)
                add_flags(RSET);
        }
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}